

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

void mctools_pathseps_generic(mcu8str *path)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = path->size;
  if ((ulong)uVar1 != 0) {
    pcVar2 = path->c_str;
    uVar5 = 0;
    do {
      if (pcVar2[uVar5] == '\\') {
        pcVar2[uVar5] = '/';
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  cVar3 = mctools_drive_letter(path);
  if (cVar3 != '\0') {
    iVar4 = mctools_impl_has_winnamespace(path);
    path->c_str[(ulong)(iVar4 != 0) * 4] = cVar3;
  }
  return;
}

Assistant:

void mctools_pathseps_generic( mcu8str* path )
  {
    mcu8str_replace( path, '\\', '/' );
    //Upper case drive letter for consistency:
    char drive_letter = mctools_drive_letter( path );
    if ( drive_letter ) {
      if ( mctools_impl_has_winnamespace( path ) )
        path->c_str[4] = drive_letter;
      else
        path->c_str[0] = drive_letter;
    }
  }